

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetShaderStatusString(SHADER_STATUS ShaderStatus,bool GetEnumString)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  bool GetEnumString_local;
  char *pcStack_10;
  SHADER_STATUS ShaderStatus_local;
  
  switch(ShaderStatus) {
  case SHADER_STATUS_UNINITIALIZED:
    pcStack_10 = "Uninitialized";
    if (GetEnumString) {
      pcStack_10 = "SHADER_STATUS_UNINITIALIZED";
    }
    break;
  case SHADER_STATUS_COMPILING:
    pcStack_10 = "Compiling";
    if (GetEnumString) {
      pcStack_10 = "SHADER_STATUS_COMPILING";
    }
    break;
  case SHADER_STATUS_READY:
    pcStack_10 = "Ready";
    if (GetEnumString) {
      pcStack_10 = "SHADER_STATUS_READY";
    }
    break;
  case SHADER_STATUS_FAILED:
    pcStack_10 = "Failed";
    if (GetEnumString) {
      pcStack_10 = "SHADER_STATUS_FAILED";
    }
    break;
  default:
    msg.field_2._M_local_buf[0xb] = GetEnumString;
    msg.field_2._12_4_ = ShaderStatus;
    FormatString<char[25]>((string *)local_38,(char (*) [25])"Unexpected shader status");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderStatusString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x9ee);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

const Char* GetShaderStatusString(SHADER_STATUS ShaderStatus, bool GetEnumString)
{
    switch (ShaderStatus)
    {
        // clang-format off
        case SHADER_STATUS_UNINITIALIZED: return GetEnumString ? "SHADER_STATUS_UNINITIALIZED" : "Uninitialized";
        case SHADER_STATUS_COMPILING:     return GetEnumString ? "SHADER_STATUS_COMPILING"     : "Compiling";
        case SHADER_STATUS_READY: 	      return GetEnumString ? "SHADER_STATUS_READY"         : "Ready";
        case SHADER_STATUS_FAILED: 	      return GetEnumString ? "SHADER_STATUS_FAILED"        : "Failed";
        // clang-format on
        default:
            UNEXPECTED("Unexpected shader status");
            return "Unknown";
    }
}